

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O2

uint16_t anon_unknown.dwarf_b5cc96::mapped_colour(uint8_t source)

{
  return (ushort)(byte)((source >> 7 | source >> 3 & 2 | source * '\x02' & 4) << 5 |
                       (source >> 5 & 1 | source >> 1 & 2) * '\x05') * 0x100 +
         (ushort)(byte)(source >> 6 & 1 | source >> 2 & 2 | source * '\x04' & 4) * 2;
}

Assistant:

uint16_t mapped_colour(uint8_t source) {
	// On the Enterprise, red and green are 3-bit quantities; blue is a 2-bit quantity.
	int red		= ((source&0x01) << 2) | ((source&0x08) >> 2) | ((source&0x40) >> 6);
	int green	= ((source&0x02) << 1) | ((source&0x10) >> 3) | ((source&0x80) >> 7);
	int blue	= ((source&0x04) >> 1) | ((source&0x20) >> 5);

	assert(red <= 7);
	assert(green <= 7);
	assert(blue <= 3);

	red = (red << 1) + (red >> 3);
	green = (green << 1) + (green >> 3);
	blue = (blue << 2) + blue;

	assert(red <= 15);
	assert(green <= 15);
	assert(blue <= 15);

	// Duplicate bits where necessary to map to a full 4-bit range per channel.
	const uint8_t parts[2] = {
		uint8_t(
			red
		),
		uint8_t(
			(green << 4) + blue
		)
	};
	return *reinterpret_cast<const uint16_t *>(parts);
}